

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mxu_s32ldd_s32lddr(DisasContext_conflict4 *ctx)

{
  TCGContext_conflict4 *tcg_ctx_00;
  uint32_t reg;
  uint32_t arg;
  uint32_t uVar1;
  uint32_t reg_00;
  TCGv_i32 t;
  TCGv_i32 ret;
  uint32_t sel;
  uint32_t s12;
  uint32_t Rb;
  uint32_t XRa;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict4 *tcg_ctx;
  DisasContext_conflict4 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i32(tcg_ctx_00);
  ret = tcg_temp_new_i32(tcg_ctx_00);
  reg = extract32(ctx->opcode,6,4);
  arg = extract32(ctx->opcode,10,10);
  uVar1 = extract32(ctx->opcode,0x14,1);
  reg_00 = extract32(ctx->opcode,0x15,5);
  gen_load_gpr(tcg_ctx_00,t,reg_00);
  tcg_gen_movi_i32(tcg_ctx_00,ret,arg);
  tcg_gen_shli_i32_mipsel(tcg_ctx_00,ret,ret,2);
  if ((arg & 0x200) != 0) {
    tcg_gen_ori_i32_mipsel(tcg_ctx_00,ret,ret,-0x1000);
  }
  tcg_gen_add_i32(tcg_ctx_00,ret,t,ret);
  tcg_gen_qemu_ld_i32_mipsel(tcg_ctx_00,ret,ret,(long)ctx->mem_idx,MO_LESL);
  if (uVar1 == 1) {
    tcg_gen_bswap32_i32_mipsel(tcg_ctx_00,ret,ret);
  }
  gen_store_mxu_gpr(tcg_ctx_00,ret,reg);
  tcg_temp_free_i32(tcg_ctx_00,t);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_mxu_s32ldd_s32lddr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;
    uint32_t XRa, Rb, s12, sel;

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    XRa = extract32(ctx->opcode, 6, 4);
    s12 = extract32(ctx->opcode, 10, 10);
    sel = extract32(ctx->opcode, 20, 1);
    Rb = extract32(ctx->opcode, 21, 5);

    gen_load_gpr(tcg_ctx, t0, Rb);

    tcg_gen_movi_tl(tcg_ctx, t1, s12);
    tcg_gen_shli_tl(tcg_ctx, t1, t1, 2);
    if (s12 & 0x200) {
        tcg_gen_ori_tl(tcg_ctx, t1, t1, 0xFFFFF000);
    }
    tcg_gen_add_tl(tcg_ctx, t1, t0, t1);
    tcg_gen_qemu_ld_tl(tcg_ctx, t1, t1, ctx->mem_idx, MO_SL);

    if (sel == 1) {
        /* S32LDDR */
        tcg_gen_bswap32_tl(tcg_ctx, t1, t1);
    }
    gen_store_mxu_gpr(tcg_ctx, t1, XRa);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}